

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O3

REF_STATUS ref_interp_walk_agent(REF_INTERP ref_interp,REF_INT id)

{
  double dVar1;
  int iVar2;
  REF_GRID pRVar3;
  REF_AGENTS ref_agents;
  REF_AGENT_STRUCT *pRVar4;
  uint uVar5;
  REF_AGENT_STRUCT *pRVar6;
  long lVar7;
  undefined8 uVar8;
  char *pcVar9;
  REF_DBL bary [4];
  REF_INT nodes [27];
  double local_d8 [5];
  REF_NODE local_b0;
  REF_INT local_a8;
  REF_INT local_a4;
  REF_INT local_a0;
  REF_INT local_9c;
  REF_CELL local_38;
  
  pRVar3 = ref_interp->from_grid;
  ref_agents = ref_interp->ref_agents;
  pRVar6 = ref_agents->agent + id;
  if (ref_agents->agent[id].step < 0xd7) {
    local_b0 = pRVar3->node;
    local_38 = (&ref_interp->from_tet)[pRVar3->twod != 0];
    do {
      if (pRVar6->mode != REF_AGENT_WALKING) {
        return 0;
      }
      uVar5 = ref_cell_nodes(local_38,pRVar6->seed,&local_a8);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x2a2,"ref_interp_walk_agent",(ulong)uVar5,"cell");
        ref_agents_tattle(ref_agents,id,"cell_nodes in walk");
        return uVar5;
      }
      if (pRVar3->twod == 0) {
        uVar5 = ref_node_bary4(local_b0,&local_a8,ref_agents->agent[id].xyz,local_d8);
        if ((uVar5 & 0xfffffffb) != 0) {
          pcVar9 = "bary";
          uVar8 = 0x2ac;
          goto LAB_0016751b;
        }
      }
      else {
        local_d8[3] = 0.0;
        uVar5 = ref_node_bary3(local_b0,&local_a8,ref_agents->agent[id].xyz,local_d8);
        if ((uVar5 & 0xfffffffb) != 0) {
          pcVar9 = "bary";
          uVar8 = 0x2a8;
          goto LAB_0016751b;
        }
      }
      if (0xd7 < ref_agents->agent[id].step) {
        printf("bary %.4e %.4e %.4e %.4e i %.2e s %d\n",local_d8[0],local_d8[1],local_d8[2],
               local_d8[3],ref_interp->inside);
        uVar5 = ref_agents_tattle(ref_agents,id,"many steps");
        if (uVar5 != 0) {
          pcVar9 = "tat";
          uVar8 = 0x2b3;
          goto LAB_0016751b;
        }
      }
      dVar1 = ref_interp->inside;
      if ((((dVar1 <= local_d8[0]) && (dVar1 <= local_d8[1])) && (dVar1 <= local_d8[2])) &&
         (dVar1 <= local_d8[3])) {
        pRVar6 = ref_agents->agent;
        pRVar6[id].mode = REF_AGENT_ENCLOSING;
        lVar7 = 0;
        do {
          pRVar6[id].bary[lVar7] = local_d8[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        return 0;
      }
      if (pRVar3->twod == 0) {
        if ((local_d8[0] >= local_d8[1] || local_d8[0] >= local_d8[2]) || local_d8[3] <= local_d8[0]
           ) {
          if (((local_d8[0] <= local_d8[1]) || (local_d8[3] <= local_d8[1])) ||
             (local_d8[2] <= local_d8[1])) {
            if (((local_d8[0] <= local_d8[2]) || (local_d8[1] <= local_d8[2])) ||
               (local_d8[3] <= local_d8[2])) {
              if (((local_d8[0] <= local_d8[3]) || (local_d8[2] <= local_d8[3])) ||
                 (local_d8[1] <= local_d8[3])) {
                if (((local_d8[1] < local_d8[0]) || (local_d8[2] < local_d8[0])) ||
                   (local_d8[3] < local_d8[0])) {
                  if (((local_d8[0] < local_d8[1]) || (local_d8[3] < local_d8[1])) ||
                     (local_d8[2] < local_d8[1])) {
                    if (((local_d8[0] < local_d8[2]) || (local_d8[1] < local_d8[2])) ||
                       (local_d8[3] < local_d8[2])) {
                      if (((local_d8[0] < local_d8[3]) || (local_d8[2] < local_d8[3])) ||
                         (local_d8[1] < local_d8[3])) goto LAB_00167407;
                      uVar5 = ref_update_agent_tet_seed(ref_interp,id,local_a8,local_a0,local_a4);
                      if (uVar5 != 0) {
                        pcVar9 = "0 2 1";
                        uVar8 = 0x314;
                        goto LAB_0016751b;
                      }
                    }
                    else {
                      uVar5 = ref_update_agent_tet_seed(ref_interp,id,local_a8,local_a4,local_9c);
                      if (uVar5 != 0) {
                        pcVar9 = "0 1 3";
                        uVar8 = 0x30d;
                        goto LAB_0016751b;
                      }
                    }
                  }
                  else {
                    uVar5 = ref_update_agent_tet_seed(ref_interp,id,local_a8,local_9c,local_a0);
                    if (uVar5 != 0) {
                      pcVar9 = "0 3 2";
                      uVar8 = 0x306;
                      goto LAB_0016751b;
                    }
                  }
                }
                else {
                  uVar5 = ref_update_agent_tet_seed(ref_interp,id,local_a4,local_a0,local_9c);
                  if (uVar5 != 0) {
                    pcVar9 = "1 2 3";
                    uVar8 = 0x2ff;
                    goto LAB_0016751b;
                  }
                }
              }
              else {
                uVar5 = ref_update_agent_tet_seed(ref_interp,id,local_a8,local_a0,local_a4);
                if (uVar5 != 0) {
                  pcVar9 = "0 2 1";
                  uVar8 = 0x2f7;
                  goto LAB_0016751b;
                }
              }
            }
            else {
              uVar5 = ref_update_agent_tet_seed(ref_interp,id,local_a8,local_a4,local_9c);
              if (uVar5 != 0) {
                pcVar9 = "0 1 3";
                uVar8 = 0x2f0;
                goto LAB_0016751b;
              }
            }
          }
          else {
            uVar5 = ref_update_agent_tet_seed(ref_interp,id,local_a8,local_9c,local_a0);
            if (uVar5 != 0) {
              pcVar9 = "0 3 2";
              uVar8 = 0x2e9;
              goto LAB_0016751b;
            }
          }
        }
        else {
          uVar5 = ref_update_agent_tet_seed(ref_interp,id,local_a4,local_a0,local_9c);
          if (uVar5 != 0) {
            pcVar9 = "1 2 3";
            uVar8 = 0x2e2;
            goto LAB_0016751b;
          }
        }
      }
      else if (local_d8[0] < local_d8[1] && local_d8[0] < local_d8[2]) {
        uVar5 = ref_update_agent_tri_seed(ref_interp,id,local_a4,local_a0);
        if (uVar5 != 0) {
          pcVar9 = "1 2";
          uVar8 = 0x2c0;
LAB_0016751b:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 uVar8,"ref_interp_walk_agent",(ulong)uVar5,pcVar9);
          return uVar5;
        }
      }
      else if ((local_d8[0] <= local_d8[1]) || (local_d8[2] <= local_d8[1])) {
        if (local_d8[0] <= local_d8[2]) {
          if ((local_d8[1] < local_d8[0]) || (local_d8[2] < local_d8[0])) {
            if ((local_d8[0] < local_d8[1]) || (local_d8[2] < local_d8[1])) {
              if (local_d8[0] < local_d8[2]) {
LAB_00167407:
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x318,"ref_interp_walk_agent","unable to find the next step");
                return 1;
              }
              uVar5 = ref_update_agent_tri_seed(ref_interp,id,local_a8,local_a4);
              if (uVar5 != 0) {
                pcVar9 = "0 1";
                uVar8 = 0x2da;
                goto LAB_0016751b;
              }
            }
            else {
              uVar5 = ref_update_agent_tri_seed(ref_interp,id,local_a0,local_a8);
              if (uVar5 != 0) {
                pcVar9 = "2 0";
                uVar8 = 0x2d5;
                goto LAB_0016751b;
              }
            }
          }
          else {
            uVar5 = ref_update_agent_tri_seed(ref_interp,id,local_a4,local_a0);
            if (uVar5 != 0) {
              pcVar9 = "1 2";
              uVar8 = 0x2d0;
              goto LAB_0016751b;
            }
          }
        }
        else {
          uVar5 = ref_update_agent_tri_seed(ref_interp,id,local_a8,local_a4);
          if (uVar5 != 0) {
            pcVar9 = "0 1";
            uVar8 = 0x2ca;
            goto LAB_0016751b;
          }
        }
      }
      else {
        uVar5 = ref_update_agent_tri_seed(ref_interp,id,local_a0,local_a8);
        if (uVar5 != 0) {
          pcVar9 = "2 0";
          uVar8 = 0x2c5;
          goto LAB_0016751b;
        }
      }
      pRVar4 = ref_agents->agent;
      pRVar6 = pRVar4 + id;
      iVar2 = pRVar4[id].step;
      pRVar4[id].step = iVar2 + 1;
    } while (iVar2 < 0xd6);
  }
  pRVar6->mode = REF_AGENT_TERMINATED;
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_walk_agent(REF_INTERP ref_interp,
                                                REF_INT id) {
  REF_GRID ref_grid = ref_interp_from_grid(ref_interp);
  REF_CELL ref_cell;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT i, limit;
  REF_DBL bary[4];
  REF_AGENTS ref_agents = ref_interp->ref_agents;

  if (ref_grid_twod(ref_grid)) {
    ref_cell = ref_interp_from_tri(ref_interp);
  } else {
    ref_cell = ref_interp_from_tet(ref_interp);
  }

  limit = 215; /* 10e6^(1/3), required 108 for twod testcase  */

  each_ref_agent_step(ref_agents, id, limit) {
    /* return if no longer walking */
    if (REF_AGENT_WALKING != ref_agent_mode(ref_agents, id)) {
      return REF_SUCCESS;
    }

    RSB(ref_cell_nodes(ref_cell, ref_agent_seed(ref_agents, id), nodes), "cell",
        { ref_agents_tattle(ref_agents, id, "cell_nodes in walk"); });
    /* when REF_DIV_ZERO, min bary is preserved */
    if (ref_grid_twod(ref_grid)) {
      bary[3] = 0.0;
      RXS(ref_node_bary3(ref_node, nodes, ref_agent_xyz_ptr(ref_agents, id),
                         bary),
          REF_DIV_ZERO, "bary");
    } else {
      RXS(ref_node_bary4(ref_node, nodes, ref_agent_xyz_ptr(ref_agents, id),
                         bary),
          REF_DIV_ZERO, "bary");
    }

    if (ref_agent_step(ref_agents, id) > (limit)) {
      printf("bary %.4e %.4e %.4e %.4e i %.2e s %d\n", bary[0], bary[1],
             bary[2], bary[3], ref_interp->inside,
             ref_agent_step(ref_agents, id));
      RSS(ref_agents_tattle(ref_agents, id, "many steps"), "tat");
    }

    if (ref_interp_bary_inside(ref_interp, bary)) {
      ref_agent_mode(ref_agents, id) = REF_AGENT_ENCLOSING;
      for (i = 0; i < 4; i++) ref_agent_bary(ref_agents, i, id) = bary[i];
      return REF_SUCCESS;
    }

    if (ref_grid_twod(ref_grid)) {
      /* less than */
      if (bary[0] < bary[1] && bary[0] < bary[2]) {
        RSS(ref_update_agent_tri_seed(ref_interp, id, nodes[1], nodes[2]),
            "1 2");
        continue;
      }
      if (bary[1] < bary[0] && bary[1] < bary[2]) {
        RSS(ref_update_agent_tri_seed(ref_interp, id, nodes[2], nodes[0]),
            "2 0");
        continue;
      }
      if (bary[2] < bary[0] && bary[2] < bary[0]) {
        RSS(ref_update_agent_tri_seed(ref_interp, id, nodes[0], nodes[1]),
            "0 1");
        continue;
      }
      /* less than or equal */
      if (bary[0] <= bary[1] && bary[0] <= bary[2]) {
        RSS(ref_update_agent_tri_seed(ref_interp, id, nodes[1], nodes[2]),
            "1 2");
        continue;
      }
      if (bary[1] <= bary[0] && bary[1] <= bary[2]) {
        RSS(ref_update_agent_tri_seed(ref_interp, id, nodes[2], nodes[0]),
            "2 0");
        continue;
      }
      if (bary[2] <= bary[0] && bary[2] <= bary[0]) {
        RSS(ref_update_agent_tri_seed(ref_interp, id, nodes[0], nodes[1]),
            "0 1");
        continue;
      }
    } else {
      /* less than */
      if (bary[0] < bary[1] && bary[0] < bary[2] && bary[0] < bary[3]) {
        RSS(ref_update_agent_tet_seed(ref_interp, id, nodes[1], nodes[2],
                                      nodes[3]),
            "1 2 3");
        continue;
      }

      if (bary[1] < bary[0] && bary[1] < bary[3] && bary[1] < bary[2]) {
        RSS(ref_update_agent_tet_seed(ref_interp, id, nodes[0], nodes[3],
                                      nodes[2]),
            "0 3 2");
        continue;
      }

      if (bary[2] < bary[0] && bary[2] < bary[1] && bary[2] < bary[3]) {
        RSS(ref_update_agent_tet_seed(ref_interp, id, nodes[0], nodes[1],
                                      nodes[3]),
            "0 1 3");
        continue;
      }

      if (bary[3] < bary[0] && bary[3] < bary[2] && bary[3] < bary[1]) {
        RSS(ref_update_agent_tet_seed(ref_interp, id, nodes[0], nodes[2],
                                      nodes[1]),
            "0 2 1");
        continue;
      }

      /* less than or equal */
      if (bary[0] <= bary[1] && bary[0] <= bary[2] && bary[0] <= bary[3]) {
        RSS(ref_update_agent_tet_seed(ref_interp, id, nodes[1], nodes[2],
                                      nodes[3]),
            "1 2 3");
        continue;
      }

      if (bary[1] <= bary[0] && bary[1] <= bary[3] && bary[1] <= bary[2]) {
        RSS(ref_update_agent_tet_seed(ref_interp, id, nodes[0], nodes[3],
                                      nodes[2]),
            "0 3 2");
        continue;
      }

      if (bary[2] <= bary[0] && bary[2] <= bary[1] && bary[2] <= bary[3]) {
        RSS(ref_update_agent_tet_seed(ref_interp, id, nodes[0], nodes[1],
                                      nodes[3]),
            "0 1 3");
        continue;
      }

      if (bary[3] <= bary[0] && bary[3] <= bary[2] && bary[3] <= bary[1]) {
        RSS(ref_update_agent_tet_seed(ref_interp, id, nodes[0], nodes[2],
                                      nodes[1]),
            "0 2 1");
        continue;
      }
    }
    THROW("unable to find the next step");
  }

  /* steps reached limit */
  ref_agent_mode(ref_agents, id) = REF_AGENT_TERMINATED;

  return REF_SUCCESS;
}